

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<pybind11::detail::value_and_holder&,long,long,int,Support>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<pybind11::detail::value_and_holder&,long,long,int,Support> *this,
          long call)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  bool bVar4;
  char local_15 [5];
  
  puVar2 = *(undefined8 **)(call + 8);
  uVar1 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 0x30) = *puVar2;
  type_caster<long,_void>::load
            ((type_caster<long,_void> *)(this + 0x28),(PyObject *)puVar2[1],
             SUB41((uVar1 & 2) >> 1,0));
  type_caster<long,_void>::load
            ((type_caster<long,_void> *)(this + 0x20),*(PyObject **)(*(long *)(call + 8) + 0x10),
             SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  type_caster<int,_void>::load
            ((type_caster<int,_void> *)(this + 0x18),*(PyObject **)(*(long *)(call + 8) + 0x18),
             SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
  type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
            ((type_caster_generic *)this,*(PyObject **)(*(long *)(call + 8) + 0x20),
             SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0));
  lVar3 = 0;
  do {
    if (local_15[lVar3] != '\x01') {
      return (bool)local_15[lVar3];
    }
    bVar4 = lVar3 != 4;
    lVar3 = lVar3 + 1;
  } while (bVar4);
  return true;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }